

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::_cb
          (stack<c4::yml::Parser::State,_16UL> *this,Callbacks *cb)

{
  bool bVar1;
  Callbacks *in_RSI;
  Callbacks *in_RDI;
  stack<c4::yml::Parser::State,_16UL> *in_stack_00000060;
  
  bVar1 = Callbacks::operator!=(in_RSI,in_RDI);
  if (bVar1) {
    _free(in_stack_00000060);
    in_RDI[0x4c].m_error = (pfn_error)in_RSI->m_user_data;
    in_RDI[0x4d].m_user_data = in_RSI->m_allocate;
    in_RDI[0x4d].m_allocate = (pfn_allocate)in_RSI->m_free;
    in_RDI[0x4d].m_free = (pfn_free)in_RSI->m_error;
  }
  return;
}

Assistant:

void stack<T, N>::_cb(Callbacks const& cb)
{
    if(cb != m_callbacks)
    {
        _free();
        m_callbacks = cb;
    }
}